

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstream.cpp
# Opt level: O0

void __thiscall
string_stream_append_Test::~string_stream_append_Test(string_stream_append_Test *this)

{
  string_stream_append_Test *this_local;
  
  ~string_stream_append_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string_stream, append)
{
    // Explicit length
    ST::string_stream ss;
    ss.append("aaaaaaaaaa", 5);
    EXPECT_EQ(5U, ss.size());
    EXPECT_EQ(ST_LITERAL("aaaaa"), ss.to_string());

    ss.append("", 0);
    EXPECT_EQ(5U, ss.size());
    EXPECT_EQ(ST_LITERAL("aaaaa"), ss.to_string());

    ss.append("bbbbbbbbbb", 10);
    EXPECT_EQ(15U, ss.size());
    EXPECT_EQ(ST_LITERAL("aaaaabbbbbbbbbb"), ss.to_string());

    // Automatic length
    ST::string_stream ss2;
    ss2.append("aaaaa");
    EXPECT_EQ(5U, ss2.size());
    EXPECT_EQ(ST_LITERAL("aaaaa"), ss2.to_string());

    ss2.append("");
    EXPECT_EQ(5U, ss2.size());
    EXPECT_EQ(ST_LITERAL("aaaaa"), ss2.to_string());

    ss2.append("bbbbbbbbbb");
    EXPECT_EQ(15U, ss2.size());
    EXPECT_EQ(ST_LITERAL("aaaaabbbbbbbbbb"), ss2.to_string());

    // Cause a heap allocation
    ST::string s1 = ST::string::fill(ST_STACK_STRING_SIZE / 2, 'x');
    ST::string s2 = ST::string::fill(ST_STACK_STRING_SIZE / 2, 'y');
    ST::string s3 = ST_LITERAL("z");
    ST::string_stream ss3;
    ss3.append(s1.c_str(), s1.size());
    ss3.append(s2.c_str(), s2.size());
    ss3.append(s3.c_str(), s3.size());
    EXPECT_EQ(s1.size() + s2.size() + s3.size(), ss3.size());
    EXPECT_EQ(s1 + s2 + s3, ss3.to_string());

    ST::string s4 = ST::string::fill(ST_STACK_STRING_SIZE * 4, 'x');
    ST::string_stream ss4;
    ss4.append(s3.c_str(), s3.size());
    ss4.append(s4.c_str(), s4.size());
    EXPECT_EQ(s3.size() + s4.size(), ss4.size());
    EXPECT_EQ(s3 + s4, ss4.to_string());
}